

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::configureFromArgs(CoreBroker *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  InvalidParameter *this_00;
  BrokerBase *this_01;
  string_view message;
  
  this_01 = &this->super_BrokerBase;
  bVar1 = BrokerBase::transitionBrokerState(this_01,CREATED,CONFIGURING);
  if (bVar1) {
    iVar2 = BrokerBase::parseArgs(this_01,argc,argv);
    if (iVar2 == 0) {
      (*this_01->_vptr_BrokerBase[2])(this_01);
      return;
    }
    BrokerBase::setBrokerState(this_01,CREATED);
    if (iVar2 < 0) {
      this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message._M_str = "invalid arguments in command line";
      message._M_len = 0x21;
      InvalidParameter::InvalidParameter(this_00,message);
      __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
  }
  return;
}

Assistant:

void CoreBroker::configureFromArgs(int argc, char* argv[])
{
    if (transitionBrokerState(BrokerState::CREATED, BrokerState::CONFIGURING)) {
        auto result = parseArgs(argc, argv);
        if (result != 0) {
            setBrokerState(BrokerState::CREATED);
            if (result < 0) {
                throw(helics::InvalidParameter("invalid arguments in command line"));
            }
            return;
        }
        configureBase();
    }
}